

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_font.cpp
# Opt level: O1

void __thiscall
FFont::BuildTranslations
          (FFont *this,double *luminosity,BYTE *identity,void *ranges,int total_colors,
          PalEntry *palette)

{
  uint *puVar1;
  short *psVar2;
  BYTE BVar3;
  int iVar4;
  short *psVar5;
  long lVar6;
  int iVar7;
  uint b;
  uint uVar8;
  int iVar9;
  short *psVar10;
  uint g;
  TArray<FRemapTable,_FRemapTable> *this_00;
  FRemapTable remap;
  FRemapTable local_78;
  PalEntry *local_58;
  TArray<FRemapTable,_FRemapTable> *local_50;
  byte *local_48;
  double *local_40;
  short *local_38;
  
  local_58 = palette;
  local_40 = luminosity;
  FRemapTable::FRemapTable(&local_78,total_colors);
  this_00 = &this->Ranges;
  uVar8 = (this->Ranges).Count;
  if (uVar8 != 0) {
    TArray<FRemapTable,_FRemapTable>::DoDelete(this_00,0,uVar8 - 1);
    (this->Ranges).Count = 0;
  }
  if (0 < NumTextColors) {
    iVar4 = 0;
    local_50 = this_00;
    local_48 = identity;
    do {
      if (iVar4 == 0xb) {
        if (identity == (byte *)0x0) {
          FRemapTable::operator=(&local_78,this_00->Array);
        }
        else {
          memcpy(local_78.Remap,identity,(long)this->ActiveColors);
          if (local_58 == (PalEntry *)0x0) {
            *local_78.Palette = (PalEntry)(GPalette.BaseColors[*identity].field_0.d & 0xffffff);
            if (1 < this->ActiveColors) {
              lVar6 = 1;
              do {
                local_78.Palette[lVar6].field_0.d =
                     GPalette.BaseColors[identity[lVar6]].field_0.d | 0xff000000;
                lVar6 = lVar6 + 1;
              } while (lVar6 < this->ActiveColors);
            }
          }
          else {
            memcpy(local_78.Palette,local_58,(long)this->ActiveColors << 2);
          }
        }
        TArray<FRemapTable,_FRemapTable>::Grow(this_00,1);
        FRemapTable::FRemapTable((this->Ranges).Array + (this->Ranges).Count,&local_78);
        puVar1 = &(this->Ranges).Count;
        *puVar1 = *puVar1 + 1;
      }
      else {
        if (*ranges < 0) {
          __assert_fail("parmstart->RangeStart >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/v_font.cpp"
                        ,0x2b8,
                        "void FFont::BuildTranslations(const double *, const BYTE *, const void *, int, const PalEntry *)"
                       );
        }
        *local_78.Remap = '\0';
        *local_78.Palette = (anon_union_4_2_12391d7c_for_PalEntry_0)0x0;
        if (1 < this->ActiveColors) {
          local_38 = (short *)((long)ranges + 10);
          lVar6 = 1;
          do {
            iVar9 = (int)(local_40[lVar6] * 256.0);
            psVar5 = local_38;
            do {
              psVar10 = psVar5;
              iVar7 = (int)psVar10[-5];
              if ((iVar7 <= iVar9) && (iVar9 <= psVar10[-4])) break;
              psVar5 = psVar10 + 5;
            } while (psVar10[-4] < *psVar10);
            iVar9 = ((iVar9 - iVar7) * 0x100) / (psVar10[-4] - iVar7);
            uVar8 = (int)(((uint)*(byte *)((long)psVar10 + -3) - (uint)*(byte *)(psVar10 + -3)) *
                          iVar9 + (uint)*(byte *)(psVar10 + -3) * 0x100) >> 8;
            g = (int)(((uint)*(byte *)(psVar10 + -1) - (uint)*(byte *)((long)psVar10 + -5)) * iVar9
                     + (uint)*(byte *)((long)psVar10 + -5) * 0x100) >> 8;
            b = (int)(((uint)*(byte *)((long)psVar10 + -1) - (uint)*(byte *)(psVar10 + -2)) * iVar9
                     + (uint)*(byte *)(psVar10 + -2) * 0x100) >> 8;
            if (0xfe < (int)uVar8) {
              uVar8 = 0xff;
            }
            if ((int)uVar8 < 1) {
              uVar8 = 0;
            }
            if (0xfe < (int)g) {
              g = 0xff;
            }
            if ((int)g < 1) {
              g = 0;
            }
            if (0xfe < (int)b) {
              b = 0xff;
            }
            if ((int)b < 1) {
              b = 0;
            }
            BVar3 = FColorMatcher::Pick(&ColorMatcher,uVar8,g,b);
            local_78.Remap[lVar6] = BVar3;
            local_78.Palette[lVar6].field_0 =
                 (anon_union_4_2_12391d7c_for_PalEntry_0)
                 (b & 0xff | (g & 0xff) << 8 | uVar8 << 0x10 | 0xff000000);
            lVar6 = lVar6 + 1;
          } while (lVar6 < this->ActiveColors);
        }
        this_00 = local_50;
        TArray<FRemapTable,_FRemapTable>::Grow(local_50,1);
        identity = local_48;
        FRemapTable::FRemapTable((this->Ranges).Array + (this->Ranges).Count,&local_78);
        puVar1 = &(this->Ranges).Count;
        *puVar1 = *puVar1 + 1;
        psVar5 = (short *)ranges;
        do {
          ranges = psVar5 + 5;
          psVar10 = psVar5 + 5;
          psVar2 = psVar5 + 1;
          psVar5 = (short *)ranges;
        } while (*psVar2 < *psVar10);
      }
      iVar4 = iVar4 + 1;
    } while (iVar4 < NumTextColors);
  }
  FRemapTable::~FRemapTable(&local_78);
  return;
}

Assistant:

void FFont::BuildTranslations (const double *luminosity, const BYTE *identity,
							   const void *ranges, int total_colors, const PalEntry *palette)
{
	int i, j;
	const TranslationParm *parmstart = (const TranslationParm *)ranges;

	FRemapTable remap(total_colors);

	// Create different translations for different color ranges
	Ranges.Clear();
	for (i = 0; i < NumTextColors; i++)
	{
		if (i == CR_UNTRANSLATED)
		{
			if (identity != NULL)
			{
				memcpy (remap.Remap, identity, ActiveColors);
				if (palette != NULL)
				{
					memcpy (remap.Palette, palette, ActiveColors*sizeof(PalEntry));
				}
				else
				{
					remap.Palette[0] = GPalette.BaseColors[identity[0]] & MAKEARGB(0,255,255,255);
					for (j = 1; j < ActiveColors; ++j)
					{
						remap.Palette[j] = GPalette.BaseColors[identity[j]] | MAKEARGB(255,0,0,0);
					}
				}
			}
			else
			{
				remap = Ranges[0];
			}
			Ranges.Push(remap);
			continue;
		}

		assert(parmstart->RangeStart >= 0);

		remap.Remap[0] = 0;
		remap.Palette[0] = 0;

		for (j = 1; j < ActiveColors; j++)
		{
			int v = int(luminosity[j] * 256.0);

			// Find the color range that this luminosity value lies within.
			const TranslationParm *parms = parmstart - 1;
			do
			{
				parms++;
				if (parms->RangeStart <= v && parms->RangeEnd >= v)
					break;
			}
			while (parms[1].RangeStart > parms[0].RangeEnd);

			// Linearly interpolate to find out which color this luminosity level gets.
			int rangev = ((v - parms->RangeStart) << 8) / (parms->RangeEnd - parms->RangeStart);
			int r = ((parms->Start[0] << 8) + rangev * (parms->End[0] - parms->Start[0])) >> 8; // red
			int g = ((parms->Start[1] << 8) + rangev * (parms->End[1] - parms->Start[1])) >> 8; // green
			int b = ((parms->Start[2] << 8) + rangev * (parms->End[2] - parms->Start[2])) >> 8; // blue
			r = clamp(r, 0, 255);
			g = clamp(g, 0, 255);
			b = clamp(b, 0, 255);
			remap.Remap[j] = ColorMatcher.Pick(r, g, b);
			remap.Palette[j] = PalEntry(255,r,g,b);
		}
		Ranges.Push(remap);

		// Advance to the next color range.
		while (parmstart[1].RangeStart > parmstart[0].RangeEnd)
		{
			parmstart++;
		}
		parmstart++;
	}
}